

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

ModuleDefinitionInfo * __thiscall
cmGeneratorTarget::GetModuleDefinitionInfo(cmGeneratorTarget *this,string *config)

{
  ModuleDefinitionInfo *this_00;
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  pointer ppVar4;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_ModuleDefinitionInfo>_&>::value,_pair<iterator,_bool>_>
  _Var5;
  iterator local_148;
  undefined1 local_140;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>
  local_138;
  undefined1 local_130 [8];
  value_type entry;
  ModuleDefinitionInfo info;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>
  local_88;
  iterator local_80;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>
  local_78;
  const_iterator i;
  string local_60;
  undefined1 local_40 [8];
  string config_upper;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  config_upper.field_2._8_8_ = config;
  TVar2 = GetType(this);
  if (((TVar2 == SHARED_LIBRARY) || (TVar2 = GetType(this), TVar2 == MODULE_LIBRARY)) ||
     (bVar1 = IsExecutableWithExports(this), bVar1)) {
    std::__cxx11::string::string((string *)local_40);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmsys::SystemTools::UpperCase(&local_60,(string *)config_upper.field_2._8_8_);
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>_>
         ::find(&this->ModuleDefinitionInfoMap,(key_type *)local_40);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>
    ::_Rb_tree_const_iterator(&local_78,&local_80);
    info.Sources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>_>
                  ::end(&this->ModuleDefinitionInfoMap);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>
    ::_Rb_tree_const_iterator
              (&local_88,
               (iterator *)
               &info.Sources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::operator==(&local_78,&local_88);
    if (bVar1) {
      this_00 = (ModuleDefinitionInfo *)
                &entry.second.Sources.
                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      ModuleDefinitionInfo::ModuleDefinitionInfo(this_00);
      ComputeModuleDefinitionInfo(this,(string *)config_upper.field_2._8_8_,this_00);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::ModuleDefinitionInfo_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
                  *)local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (ModuleDefinitionInfo *)
                 &entry.second.Sources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      _Var5 = std::
              map<std::__cxx11::string,cmGeneratorTarget::ModuleDefinitionInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>>
              ::
              insert<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>&>
                        ((map<std::__cxx11::string,cmGeneratorTarget::ModuleDefinitionInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>>
                          *)&this->ModuleDefinitionInfoMap,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
                          *)local_130);
      local_148._M_node = (_Base_ptr)_Var5.first._M_node;
      local_140 = _Var5.second;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>
      ::_Rb_tree_const_iterator(&local_138,&local_148);
      local_78._M_node = local_138._M_node;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
               *)local_130);
      ModuleDefinitionInfo::~ModuleDefinitionInfo
                ((ModuleDefinitionInfo *)
                 &entry.second.Sources.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>
             ::operator->(&local_78);
    this_local = (cmGeneratorTarget *)&ppVar4->second;
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this_local = (cmGeneratorTarget *)0x0;
  }
  return (ModuleDefinitionInfo *)this_local;
}

Assistant:

cmGeneratorTarget::ModuleDefinitionInfo const*
cmGeneratorTarget::GetModuleDefinitionInfo(std::string const& config) const
{
  // A module definition file only makes sense on certain target types.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return CM_NULLPTR;
  }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  ModuleDefinitionInfoMapType::const_iterator i =
    this->ModuleDefinitionInfoMap.find(config_upper);
  if (i == this->ModuleDefinitionInfoMap.end()) {
    ModuleDefinitionInfo info;
    this->ComputeModuleDefinitionInfo(config, info);
    ModuleDefinitionInfoMapType::value_type entry(config_upper, info);
    i = this->ModuleDefinitionInfoMap.insert(entry).first;
  }
  return &i->second;
}